

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::D3D6::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,D3D6 *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdDmaNotify *this_02;
  MthdDmaGrobj *pMVar2;
  MthdCtxSurf3D *this_03;
  MthdD3D56TexOffset *pMVar3;
  MthdD3D56TexFormat *pMVar4;
  MthdD3D56TexFilter *pMVar5;
  MthdD3D6CombineControl *pMVar6;
  MthdD3D6CombineFactor *this_04;
  MthdD3D56Blend *this_05;
  MthdD3D56Config *this_06;
  MthdD3D6StencilFunc *this_07;
  MthdD3D6StencilOp *this_08;
  MthdD3D56FogColor *this_09;
  MthdD3D56TlvX *this_10;
  MthdD3D56TlvY *this_11;
  MthdD3D56TlvZ *this_12;
  MthdD3D56TlvRhw *this_13;
  MthdD3D56TlvColor *this_14;
  MthdD3D56TlvFogCol1 *this_15;
  MthdD3D56TlvUv *pMVar7;
  UntestedMthd *this_16;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_663;
  undefined1 local_662;
  allocator local_661;
  string local_660 [38];
  undefined1 local_63a;
  allocator local_639;
  string local_638 [38];
  undefined1 local_612;
  allocator local_611;
  string local_610 [38];
  undefined1 local_5ea;
  allocator local_5e9;
  string local_5e8 [38];
  undefined1 local_5c2;
  allocator local_5c1;
  string local_5c0 [38];
  undefined1 local_59a;
  allocator local_599;
  string local_598 [38];
  undefined1 local_572;
  allocator local_571;
  string local_570 [38];
  undefined1 local_54a;
  allocator local_549;
  string local_548 [38];
  undefined1 local_522;
  allocator local_521;
  string local_520 [38];
  undefined1 local_4fa;
  allocator local_4f9;
  string local_4f8 [38];
  undefined1 local_4d2;
  allocator local_4d1;
  string local_4d0 [38];
  undefined1 local_4aa;
  allocator local_4a9;
  string local_4a8 [38];
  undefined1 local_482;
  allocator local_481;
  string local_480 [38];
  undefined1 local_45a;
  allocator local_459;
  string local_458 [38];
  undefined1 local_432;
  allocator local_431;
  string local_430 [38];
  undefined1 local_40a;
  allocator local_409;
  string local_408 [38];
  undefined1 local_3e2;
  allocator local_3e1;
  string local_3e0 [38];
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [38];
  undefined1 local_36a;
  allocator local_369;
  string local_368 [38];
  undefined1 local_342;
  allocator local_341;
  string local_340 [38];
  undefined1 local_31a;
  allocator local_319;
  string local_318 [38];
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [38];
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8 [38];
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [38];
  undefined1 local_27a;
  allocator local_279;
  string local_278 [38];
  undefined1 local_252;
  allocator local_251;
  string local_250 [38];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [38];
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [38];
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [38];
  undefined1 local_18a;
  allocator local_189;
  string local_188 [38];
  undefined1 local_162;
  allocator local_161;
  string local_160 [48];
  SingleMthdTest *local_130;
  MthdNotify *local_128;
  MthdDmaNotify *local_120;
  MthdDmaGrobj *local_118;
  MthdDmaGrobj *local_110;
  MthdCtxSurf3D *local_108;
  MthdD3D56TexOffset *local_100;
  MthdD3D56TexOffset *local_f8;
  MthdD3D56TexFormat *local_f0;
  MthdD3D56TexFormat *local_e8;
  MthdD3D56TexFilter *local_e0;
  MthdD3D56TexFilter *local_d8;
  MthdD3D6CombineControl *local_d0;
  MthdD3D6CombineControl *local_c8;
  MthdD3D6CombineControl *local_c0;
  MthdD3D6CombineControl *local_b8;
  MthdD3D6CombineFactor *local_b0;
  MthdD3D56Blend *local_a8;
  MthdD3D56Config *local_a0;
  MthdD3D6StencilFunc *local_98;
  MthdD3D6StencilOp *local_90;
  MthdD3D56FogColor *local_88;
  MthdD3D56TlvX *local_80;
  MthdD3D56TlvY *local_78;
  MthdD3D56TlvZ *local_70;
  MthdD3D56TlvRhw *local_68;
  MthdD3D56TlvColor *local_60;
  MthdD3D56TlvFogCol1 *local_58;
  MthdD3D56TlvUv *local_50;
  MthdD3D56TlvUv *local_48;
  MthdD3D56TlvUv *local_40;
  MthdD3D56TlvUv *local_38;
  UntestedMthd *local_30;
  iterator local_28;
  size_type local_20;
  D3D6 *local_18;
  D3D6 *this_local;
  
  local_18 = this;
  this_local = (D3D6 *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_162 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"nop",&local_161);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_160,-1,
             (this->super_Class).cls,0x100,1,4);
  local_162 = 0;
  local_130 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_18a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"notify",&local_189);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_188,-1,
             (this->super_Class).cls,0x104,1,4);
  local_18a = 0;
  local_128 = this_01;
  this_02 = (MthdDmaNotify *)operator_new(0x25950);
  local_1b2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"dma_notify",&local_1b1);
  MthdDmaNotify::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1b0,-1,
             (this->super_Class).cls,0x180,1,4);
  local_1b2 = 0;
  local_120 = this_02;
  pMVar2 = (MthdDmaGrobj *)operator_new(0x25960);
  local_1da = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"dma_tex_a",&local_1d9);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1d8,-1,
             (this->super_Class).cls,0x184,0,4);
  local_1da = 0;
  local_118 = pMVar2;
  pMVar2 = (MthdDmaGrobj *)operator_new(0x25960);
  local_202 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"dma_tex_b",&local_201);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_200,-1,
             (this->super_Class).cls,0x188,1,4);
  local_202 = 0;
  local_110 = pMVar2;
  this_03 = (MthdCtxSurf3D *)operator_new(0x25958);
  local_22a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"ctx_surf3d",&local_229);
  MthdCtxSurf3D::MthdCtxSurf3D
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_228,-1,
             (this->super_Class).cls,0x18c,0);
  local_22a = 0;
  local_108 = this_03;
  pMVar3 = (MthdD3D56TexOffset *)operator_new(0x25958);
  local_252 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"tex_0_offset",&local_251);
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_250,-1,
             (this->super_Class).cls,0x308,1);
  local_252 = 0;
  local_100 = pMVar3;
  pMVar3 = (MthdD3D56TexOffset *)operator_new(0x25958);
  local_27a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"tex_1_offset",&local_279);
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_278,-1,
             (this->super_Class).cls,0x30c,2);
  local_27a = 0;
  local_f8 = pMVar3;
  pMVar4 = (MthdD3D56TexFormat *)operator_new(0x25958);
  local_2a2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"tex_0_format",&local_2a1);
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2a0,-1,
             (this->super_Class).cls,0x310,1);
  local_2a2 = 0;
  local_f0 = pMVar4;
  pMVar4 = (MthdD3D56TexFormat *)operator_new(0x25958);
  local_2ca = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"tex_1_format",&local_2c9);
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2c8,-1,
             (this->super_Class).cls,0x314,2);
  local_2ca = 0;
  local_e8 = pMVar4;
  pMVar5 = (MthdD3D56TexFilter *)operator_new(0x25958);
  local_2f2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"tex_0_filter",&local_2f1);
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2f0,-1,
             (this->super_Class).cls,0x318,1);
  local_2f2 = 0;
  local_e0 = pMVar5;
  pMVar5 = (MthdD3D56TexFilter *)operator_new(0x25958);
  local_31a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"tex_1_filter",&local_319);
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_318,-1,
             (this->super_Class).cls,0x31c,2);
  local_31a = 0;
  local_d8 = pMVar5;
  pMVar6 = (MthdD3D6CombineControl *)operator_new(0x25958);
  local_342 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"combine_0_control_alpha",&local_341);
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_340,-1,
             (this->super_Class).cls,800,0,0);
  local_342 = 0;
  local_d0 = pMVar6;
  pMVar6 = (MthdD3D6CombineControl *)operator_new(0x25958);
  local_36a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"combine_0_control_color",&local_369);
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_368,-1,
             (this->super_Class).cls,0x324,0,1);
  local_36a = 0;
  local_c8 = pMVar6;
  pMVar6 = (MthdD3D6CombineControl *)operator_new(0x25958);
  local_392 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"combine_1_control_alpha",&local_391);
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_390,-1,
             (this->super_Class).cls,0x32c,1,0);
  local_392 = 0;
  local_c0 = pMVar6;
  pMVar6 = (MthdD3D6CombineControl *)operator_new(0x25958);
  local_3ba = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"combine_1_control_color",&local_3b9);
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3b8,-1,
             (this->super_Class).cls,0x330,1,1);
  local_3ba = 0;
  local_b8 = pMVar6;
  this_04 = (MthdD3D6CombineFactor *)operator_new(0x25950);
  local_3e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"combine_factor",&local_3e1);
  MthdD3D6CombineFactor::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3e0,-1,
             (this->super_Class).cls,0x334,1,4);
  local_3e2 = 0;
  local_b0 = this_04;
  this_05 = (MthdD3D56Blend *)operator_new(0x25950);
  local_40a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"blend",&local_409);
  MthdD3D56Blend::SingleMthdTest
            (this_05,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_408,-1,
             (this->super_Class).cls,0x338,1,4);
  local_40a = 0;
  local_a8 = this_05;
  this_06 = (MthdD3D56Config *)operator_new(0x25950);
  local_432 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"config",&local_431);
  MthdD3D56Config::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_430,-1,
             (this->super_Class).cls,0x33c,1,4);
  local_432 = 0;
  local_a0 = this_06;
  this_07 = (MthdD3D6StencilFunc *)operator_new(0x25950);
  local_45a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"stencil_func",&local_459);
  MthdD3D6StencilFunc::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_458,-1,
             (this->super_Class).cls,0x340,1,4);
  local_45a = 0;
  local_98 = this_07;
  this_08 = (MthdD3D6StencilOp *)operator_new(0x25950);
  local_482 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"stencil_op",&local_481);
  MthdD3D6StencilOp::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_480,-1,
             (this->super_Class).cls,0x344,1,4);
  local_482 = 0;
  local_90 = this_08;
  this_09 = (MthdD3D56FogColor *)operator_new(0x25950);
  local_4aa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"fog_color",&local_4a9);
  MthdD3D56FogColor::SingleMthdTest
            (this_09,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_4a8,-1,
             (this->super_Class).cls,0x348,1,4);
  local_4aa = 0;
  local_88 = this_09;
  this_10 = (MthdD3D56TlvX *)operator_new(0x25950);
  local_4d2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"tlv_x",&local_4d1);
  MthdD3D56TlvX::SingleMthdTest
            (this_10,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_4d0,-1,
             (this->super_Class).cls,0x400,8,0x28);
  local_4d2 = 0;
  local_80 = this_10;
  this_11 = (MthdD3D56TlvY *)operator_new(0x25950);
  local_4fa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"tlv_y",&local_4f9);
  MthdD3D56TlvY::SingleMthdTest
            (this_11,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_4f8,-1,
             (this->super_Class).cls,0x404,8,0x28);
  local_4fa = 0;
  local_78 = this_11;
  this_12 = (MthdD3D56TlvZ *)operator_new(0x25950);
  local_522 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"tlv_z",&local_521);
  MthdD3D56TlvZ::SingleMthdTest
            (this_12,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_520,-1,
             (this->super_Class).cls,0x408,8,0x28);
  local_522 = 0;
  local_70 = this_12;
  this_13 = (MthdD3D56TlvRhw *)operator_new(0x25950);
  local_54a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"tlv_rhw",&local_549);
  MthdD3D56TlvRhw::SingleMthdTest
            (this_13,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_548,-1,
             (this->super_Class).cls,0x40c,8,0x28);
  local_54a = 0;
  local_68 = this_13;
  this_14 = (MthdD3D56TlvColor *)operator_new(0x25950);
  local_572 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"tlv_color",&local_571);
  MthdD3D56TlvColor::SingleMthdTest
            (this_14,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_570,-1,
             (this->super_Class).cls,0x410,8,0x28);
  local_572 = 0;
  local_60 = this_14;
  this_15 = (MthdD3D56TlvFogCol1 *)operator_new(0x25950);
  local_59a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"tlv_fog_col1",&local_599);
  MthdD3D56TlvFogCol1::SingleMthdTest
            (this_15,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_598,-1,
             (this->super_Class).cls,0x414,8,0x28);
  local_59a = 0;
  local_58 = this_15;
  pMVar7 = (MthdD3D56TlvUv *)operator_new(0x25960);
  local_5c2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"tlv_u_0",&local_5c1);
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_5c0,-1,
             (this->super_Class).cls,0x418,8,0x28,0,0,false);
  local_5c2 = 0;
  local_50 = pMVar7;
  pMVar7 = (MthdD3D56TlvUv *)operator_new(0x25960);
  local_5ea = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"tlv_v_0",&local_5e9);
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_5e8,-1,
             (this->super_Class).cls,0x41c,8,0x28,0,1,false);
  local_5ea = 0;
  local_48 = pMVar7;
  pMVar7 = (MthdD3D56TlvUv *)operator_new(0x25960);
  local_612 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"tlv_u_1",&local_611);
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_610,-1,
             (this->super_Class).cls,0x420,8,0x28,1,0,false);
  local_612 = 0;
  local_40 = pMVar7;
  pMVar7 = (MthdD3D56TlvUv *)operator_new(0x25960);
  local_63a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"tlv_v_1",&local_639);
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_638,-1,
             (this->super_Class).cls,0x424,8,0x28,1,1,true);
  local_63a = 0;
  local_38 = pMVar7;
  this_16 = (UntestedMthd *)operator_new(0x25950);
  local_662 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"draw",&local_661);
  UntestedMthd::SingleMthdTest
            (this_16,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_660,-1,
             (this->super_Class).cls,0x540,0x30,4);
  local_662 = 0;
  local_28 = &local_130;
  local_20 = 0x21;
  local_30 = this_16;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_663);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_663);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_663);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> D3D6::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", -1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", -1, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", -1, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", -1, cls, 0x18c, SURF2D_NV4),
		new MthdD3D56TexOffset(opt, rnd(), "tex_0_offset", -1, cls, 0x308, 1),
		new MthdD3D56TexOffset(opt, rnd(), "tex_1_offset", -1, cls, 0x30c, 2),
		new MthdD3D56TexFormat(opt, rnd(), "tex_0_format", -1, cls, 0x310, 1),
		new MthdD3D56TexFormat(opt, rnd(), "tex_1_format", -1, cls, 0x314, 2),
		new MthdD3D56TexFilter(opt, rnd(), "tex_0_filter", -1, cls, 0x318, 1),
		new MthdD3D56TexFilter(opt, rnd(), "tex_1_filter", -1, cls, 0x31c, 2),
		new MthdD3D6CombineControl(opt, rnd(), "combine_0_control_alpha", -1, cls, 0x320, 0, 0),
		new MthdD3D6CombineControl(opt, rnd(), "combine_0_control_color", -1, cls, 0x324, 0, 1),
		new MthdD3D6CombineControl(opt, rnd(), "combine_1_control_alpha", -1, cls, 0x32c, 1, 0),
		new MthdD3D6CombineControl(opt, rnd(), "combine_1_control_color", -1, cls, 0x330, 1, 1),
		new MthdD3D6CombineFactor(opt, rnd(), "combine_factor", -1, cls, 0x334),
		new MthdD3D56Blend(opt, rnd(), "blend", -1, cls, 0x338),
		new MthdD3D56Config(opt, rnd(), "config", -1, cls, 0x33c),
		new MthdD3D6StencilFunc(opt, rnd(), "stencil_func", -1, cls, 0x340),
		new MthdD3D6StencilOp(opt, rnd(), "stencil_op", -1, cls, 0x344),
		new MthdD3D56FogColor(opt, rnd(), "fog_color", -1, cls, 0x348),
		new MthdD3D56TlvX(opt, rnd(), "tlv_x", -1, cls, 0x400, 8, 0x28),
		new MthdD3D56TlvY(opt, rnd(), "tlv_y", -1, cls, 0x404, 8, 0x28),
		new MthdD3D56TlvZ(opt, rnd(), "tlv_z", -1, cls, 0x408, 8, 0x28),
		new MthdD3D56TlvRhw(opt, rnd(), "tlv_rhw", -1, cls, 0x40c, 8, 0x28),
		new MthdD3D56TlvColor(opt, rnd(), "tlv_color", -1, cls, 0x410, 8, 0x28),
		new MthdD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", -1, cls, 0x414, 8, 0x28),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u_0", -1, cls, 0x418, 8, 0x28, 0, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v_0", -1, cls, 0x41c, 8, 0x28, 0, 1, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u_1", -1, cls, 0x420, 8, 0x28, 1, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v_1", -1, cls, 0x424, 8, 0x28, 1, 1, true),
		new UntestedMthd(opt, rnd(), "draw", -1, cls, 0x540, 0x30),
	};
}